

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * __thiscall
cmGeneratorTarget::GetPchHeader
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *language,
          string *arch)

{
  char cVar1;
  _Base_ptr p_Var2;
  cmMakefile *pcVar3;
  bool bVar4;
  int iVar5;
  Encoding encoding;
  long *plVar6;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var7;
  cmGeneratorTarget *pcVar8;
  string *psVar9;
  mapped_type *pmVar10;
  cmValue cVar11;
  cmValue cVar12;
  ostream *poVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  char *pcVar15;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *header_bt;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  pointer filename;
  long lVar17;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar18;
  string filename_tmp;
  string firstHeaderOnDisk;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  languageToExtension;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  headers;
  cmGeneratedFileStream file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  cmGeneratorTarget *local_320;
  string local_318;
  _Base_ptr local_2f8;
  undefined1 local_2f0 [48];
  string *local_2c0;
  cmGeneratorTarget *local_2b8;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2b0;
  undefined1 local_298 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  _Alloc_hider local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_258;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8 [6];
  
  iVar5 = std::__cxx11::string::compare((char *)language);
  if ((((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)language), iVar5 == 0)) ||
      (iVar5 = std::__cxx11::string::compare((char *)language), iVar5 == 0)) ||
     (iVar5 = std::__cxx11::string::compare((char *)language), iVar5 == 0)) {
    local_298._0_8_ = &local_288;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_298,"DISABLE_PRECOMPILE_HEADERS","");
    bVar4 = cmTarget::GetPropertyAsBool(this->Target,(string *)local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._0_8_ != &local_288) {
      operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
    }
    if (!bVar4) {
      local_298._0_8_ = &local_288;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_298,"PRECOMPILE_HEADERS_REUSE_FROM","");
      local_2c0 = (string *)GetProperty(this,(string *)local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._0_8_ != &local_288) {
        operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
      }
      local_320 = this;
      std::operator+(&local_340,language,config);
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_340,(ulong)(arch->_M_dataplus)._M_p);
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_2f0 + 0x10);
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar14) {
        local_2f0._16_8_ = paVar14->_M_allocated_capacity;
        local_2f0._24_8_ = plVar6[3];
        local_2f0._0_8_ = paVar16;
      }
      else {
        local_2f0._16_8_ = paVar14->_M_allocated_capacity;
        local_2f0._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar6;
      }
      local_298._8_8_ = plVar6[1];
      *plVar6 = (long)paVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      local_298._0_8_ = &local_288;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._0_8_ == paVar16) {
        local_288._8_8_ = local_2f0._24_8_;
      }
      else {
        local_298._0_8_ = local_2f0._0_8_;
      }
      local_288._M_allocated_capacity = local_2f0._16_8_;
      local_2f0._8_8_ = 0;
      local_2f0._16_8_ = local_2f0._16_8_ & 0xffffffffffffff00;
      local_278._M_p = "";
      local_2f0._0_8_ = paVar16;
      pVar18 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
               ::_M_emplace_unique<std::pair<std::__cxx11::string,char_const*>>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                           *)&local_320->PchHeaders,
                          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
                           *)local_298);
      _Var7 = pVar18.first._M_node;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._0_8_ != &local_288) {
        operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._0_8_ != paVar16) {
        operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
      }
      pcVar8 = local_320;
      if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        GetPrecompileHeaders(&local_2b0,local_320,config,language);
        if (local_2b0.
            super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_2b0.
            super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish && local_2c0 == (string *)0x0) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&local_2b0);
          return __return_storage_ptr__;
        }
        if (local_2c0 != (string *)0x0) {
          pcVar8 = cmGlobalGenerator::FindGeneratorTarget
                             (local_320->LocalGenerator->GlobalGenerator,local_2c0);
        }
        psVar9 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar8->LocalGenerator);
        local_298._8_8_ = (psVar9->_M_dataplus)._M_p;
        local_298._0_8_ = psVar9->_M_string_length;
        local_288._M_allocated_capacity = 1;
        local_288._8_8_ = (long)"in Json::Value::setComment(): Comments must start with /" + 0x37;
        views._M_len = 2;
        views._M_array = (iterator)local_298;
        local_2b8 = pcVar8;
        cmCatViews_abi_cxx11_((string *)local_2f0,views);
        local_2f8 = _Var7._M_node + 2;
        std::__cxx11::string::operator=((string *)local_2f8,(string *)local_2f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._0_8_ != paVar16) {
          operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
        }
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_298,(char (*) [2])0x77bf79,(char (*) [3])0x7a0503);
        pcVar8 = local_320;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[4],_const_char_(&)[5],_true>
                  (&local_258,(char (*) [4])0x76a0cc,(char (*) [5])0x7a050d);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[5],_const_char_(&)[8],_true>
                  (&local_218,(char (*) [5])"OBJC",(char (*) [8])".objc.h");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[7],_const_char_(&)[12],_true>
                  (local_1d8,(char (*) [7])"OBJCXX",(char (*) [12])".objcxx.hxx");
        __l._M_len = 4;
        __l._M_array = (iterator)local_298;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_2f0,__l,
              (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_340,(allocator_type *)&local_318);
        lVar17 = -0x100;
        paVar16 = &local_1d8[0].second.field_2;
        do {
          if (paVar16 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(&paVar16->_M_allocated_capacity)[-2]) {
            operator_delete((long *)(&paVar16->_M_allocated_capacity)[-2],
                            paVar16->_M_allocated_capacity + 1);
          }
          if (&paVar16->_M_allocated_capacity + -4 !=
              (size_type *)(&paVar16->_M_allocated_capacity)[-6]) {
            operator_delete((size_type *)(&paVar16->_M_allocated_capacity)[-6],
                            (&paVar16->_M_allocated_capacity)[-4] + 1);
          }
          paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar16->_M_allocated_capacity + -8);
          lVar17 = lVar17 + 0x40;
        } while (lVar17 != 0);
        pcVar15 = *(char **)(_Var7._M_node + 2);
        p_Var2 = _Var7._M_node[2]._M_parent;
        psVar9 = cmTarget::GetName_abi_cxx11_(local_2b8->Target);
        local_288._M_allocated_capacity = 0xb;
        local_288._8_8_ = (long)"**/CMakeFiles/" + 3;
        local_270 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(psVar9->_M_dataplus)._M_p;
        local_278._M_p = (pointer)psVar9->_M_string_length;
        local_268._M_allocated_capacity = 4;
        local_268._8_8_ = (long)"/CMakeFiles/CMakeRelink.dir" + 0x17;
        views_00._M_len = 4;
        views_00._M_array = (iterator)local_298;
        local_298._0_8_ = p_Var2;
        local_298._8_8_ = pcVar15;
        cmCatViews_abi_cxx11_(&local_340,views_00);
        std::__cxx11::string::operator=((string *)local_2f8,(string *)&local_340);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != &local_340.field_2) {
          operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
        }
        iVar5 = (*pcVar8->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[0x26])();
        if ((char)iVar5 != '\0') {
          local_298._8_8_ = *(undefined8 *)(_Var7._M_node + 2);
          local_298._0_8_ = _Var7._M_node[2]._M_parent;
          local_288._M_allocated_capacity = 1;
          local_288._8_8_ = (long)"in Json::Value::setComment(): Comments must start with /" + 0x37;
          local_270 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(config->_M_dataplus)._M_p;
          local_278._M_p = (pointer)config->_M_string_length;
          views_01._M_len = 3;
          views_01._M_array = (iterator)local_298;
          cmCatViews_abi_cxx11_(&local_340,views_01);
          std::__cxx11::string::operator=((string *)local_2f8,(string *)&local_340);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_340._M_dataplus._M_p != &local_340.field_2) {
            operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
          }
        }
        pcVar15 = *(char **)(_Var7._M_node + 2);
        p_Var2 = _Var7._M_node[2]._M_parent;
        if (arch->_M_string_length == 0) {
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"");
        }
        else {
          local_288._8_8_ = (arch->_M_dataplus)._M_p;
          local_298._0_8_ = &DAT_00000001;
          local_298._8_8_ = "_";
          views_02._M_len = 2;
          views_02._M_array = (iterator)local_298;
          local_288._M_allocated_capacity = arch->_M_string_length;
          cmCatViews_abi_cxx11_(&local_318,views_02);
        }
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_2f0,language);
        local_288._M_allocated_capacity = 10;
        local_288._8_8_ = (long)".dir/cmake_pch" + 4;
        local_278._M_p = (pointer)local_318._M_string_length;
        local_270 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_318._M_dataplus._M_p;
        local_268._8_8_ = (pmVar10->_M_dataplus)._M_p;
        local_268._M_allocated_capacity = pmVar10->_M_string_length;
        views_03._M_len = 4;
        views_03._M_array = (iterator)local_298;
        local_298._0_8_ = p_Var2;
        local_298._8_8_ = pcVar15;
        cmCatViews_abi_cxx11_(&local_340,views_03);
        std::__cxx11::string::operator=((string *)local_2f8,(string *)&local_340);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != &local_340.field_2) {
          operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
        }
        psVar9 = local_2c0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,
                          CONCAT71(local_318.field_2._M_allocated_capacity._1_7_,
                                   local_318.field_2._M_local_buf[0]) + 1);
        }
        local_298._8_8_ = *(undefined8 *)(_Var7._M_node + 2);
        local_298._0_8_ = _Var7._M_node[2]._M_parent;
        local_288._M_allocated_capacity = 4;
        local_288._8_8_ = (long)"%s.%s.tmp" + 5;
        views_04._M_len = 2;
        views_04._M_array = (iterator)local_298;
        cmCatViews_abi_cxx11_(&local_340,views_04);
        if (psVar9 == (string *)0x0) {
          pcVar3 = pcVar8->Makefile;
          local_298._0_8_ = &local_288;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_298,"CMAKE_PCH_PROLOGUE","");
          cVar11 = cmMakefile::GetDefinition(pcVar3,(string *)local_298);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._0_8_ != &local_288) {
            operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
          }
          pcVar3 = pcVar8->Makefile;
          local_298._0_8_ = &local_288;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_298,"CMAKE_PCH_EPILOGUE","");
          cVar12 = cmMakefile::GetDefinition(pcVar3,(string *)local_298);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._0_8_ != &local_288) {
            operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
          }
          local_318._M_string_length = 0;
          local_318.field_2._M_local_buf[0] = '\0';
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          encoding = (*pcVar8->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[5])();
          cmGeneratedFileStream::cmGeneratedFileStream
                    ((cmGeneratedFileStream *)local_298,&local_340,false,encoding);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_298,"/* generated by CMake */\n\n",0x1a);
          if (cVar11.Value != (string *)0x0) {
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_298,((cVar11.Value)->_M_dataplus)._M_p,
                                 (cVar11.Value)->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
          }
          iVar5 = (*pcVar8->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[0x27])();
          if ((char)iVar5 != '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_298,"#ifndef CMAKE_SKIP_PRECOMPILE_HEADERS\n",0x26);
          }
          iVar5 = std::__cxx11::string::compare((char *)language);
          if ((iVar5 == 0) &&
             (iVar5 = (*pcVar8->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[0x27])(),
             (char)iVar5 == '\0')) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_298,"#ifdef __cplusplus\n",0x13);
          }
          if (local_2b0.
              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_2b0.
              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            filename = local_2b0.
                       super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            do {
              if ((filename->Value)._M_string_length != 0) {
                cVar1 = *(filename->Value)._M_dataplus._M_p;
                if ((cVar1 == '<') || (cVar1 == '\"')) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_298,"#include ",9);
                  poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_298,(filename->Value)._M_dataplus._M_p,
                                       (filename->Value)._M_string_length);
                  lVar17 = 1;
                  pcVar15 = "\n";
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_298,"#include \"",10);
                  poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_298,(filename->Value)._M_dataplus._M_p,
                                       (filename->Value)._M_string_length);
                  lVar17 = 2;
                  pcVar15 = "\"\n";
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar15,lVar17);
                bVar4 = cmsys::SystemTools::FileExists(&filename->Value);
                if (bVar4 && (char *)local_318._M_string_length == (char *)0x0) {
                  std::__cxx11::string::_M_assign((string *)&local_318);
                }
              }
              filename = filename + 1;
            } while (filename !=
                     local_2b0.
                     super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          }
          iVar5 = std::__cxx11::string::compare((char *)language);
          pcVar8 = local_320;
          if ((iVar5 == 0) &&
             (iVar5 = (*local_320->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[0x27])()
             , (char)iVar5 == '\0')) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_298,"#endif // __cplusplus\n",0x16);
          }
          iVar5 = (*pcVar8->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[0x27])();
          if ((char)iVar5 != '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_298,"#endif // CMAKE_SKIP_PRECOMPILE_HEADERS\n",0x28);
          }
          if (cVar12.Value != (string *)0x0) {
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_298,((cVar12.Value)->_M_dataplus)._M_p,
                                 (cVar12.Value)->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
          }
          cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
          if ((char *)local_318._M_string_length != (char *)0x0) {
            cmFileTimes::Copy(&local_318,&local_340);
          }
          cmSystemTools::MoveFileIfDifferent(&local_340,(string *)local_2f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) {
            operator_delete(local_318._M_dataplus._M_p,
                            CONCAT71(local_318.field_2._M_allocated_capacity._1_7_,
                                     local_318.field_2._M_local_buf[0]) + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != &local_340.field_2) {
          operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_2f0);
        std::
        vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_2b0);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,*(long *)(_Var7._M_node + 2),
                 (long)&(_Var7._M_node[2]._M_parent)->_M_color + *(long *)(_Var7._M_node + 2));
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetPchHeader(const std::string& config,
                                            const std::string& language,
                                            const std::string& arch) const
{
  if (language != "C" && language != "CXX" && language != "OBJC" &&
      language != "OBJCXX") {
    return std::string();
  }

  if (this->GetPropertyAsBool("DISABLE_PRECOMPILE_HEADERS")) {
    return std::string();
  }
  const cmGeneratorTarget* generatorTarget = this;
  cmValue pchReuseFrom =
    generatorTarget->GetProperty("PRECOMPILE_HEADERS_REUSE_FROM");

  const auto inserted =
    this->PchHeaders.insert(std::make_pair(language + config + arch, ""));
  if (inserted.second) {
    const std::vector<BT<std::string>> headers =
      this->GetPrecompileHeaders(config, language);
    if (headers.empty() && !pchReuseFrom) {
      return std::string();
    }
    std::string& filename = inserted.first->second;

    if (pchReuseFrom) {
      generatorTarget =
        this->GetGlobalGenerator()->FindGeneratorTarget(*pchReuseFrom);
    }

    filename = cmStrCat(
      generatorTarget->LocalGenerator->GetCurrentBinaryDirectory(), "/");

    const std::map<std::string, std::string> languageToExtension = {
      { "C", ".h" },
      { "CXX", ".hxx" },
      { "OBJC", ".objc.h" },
      { "OBJCXX", ".objcxx.hxx" }
    };

    filename =
      cmStrCat(filename, "CMakeFiles/", generatorTarget->GetName(), ".dir");

    if (this->GetGlobalGenerator()->IsMultiConfig()) {
      filename = cmStrCat(filename, "/", config);
    }

    filename =
      cmStrCat(filename, "/cmake_pch", arch.empty() ? "" : cmStrCat("_", arch),
               languageToExtension.at(language));

    const std::string filename_tmp = cmStrCat(filename, ".tmp");
    if (!pchReuseFrom) {
      cmValue pchPrologue =
        this->Makefile->GetDefinition("CMAKE_PCH_PROLOGUE");
      cmValue pchEpilogue =
        this->Makefile->GetDefinition("CMAKE_PCH_EPILOGUE");

      std::string firstHeaderOnDisk;
      {
        cmGeneratedFileStream file(
          filename_tmp, false,
          this->GetGlobalGenerator()->GetMakefileEncoding());
        file << "/* generated by CMake */\n\n";
        if (pchPrologue) {
          file << *pchPrologue << "\n";
        }
        if (this->GetGlobalGenerator()->IsXcode()) {
          file << "#ifndef CMAKE_SKIP_PRECOMPILE_HEADERS\n";
        }
        if (language == "CXX" && !this->GetGlobalGenerator()->IsXcode()) {
          file << "#ifdef __cplusplus\n";
        }
        for (auto const& header_bt : headers) {
          if (header_bt.Value.empty()) {
            continue;
          }
          if (header_bt.Value[0] == '<' || header_bt.Value[0] == '\"') {
            file << "#include " << header_bt.Value << "\n";
          } else {
            file << "#include \"" << header_bt.Value << "\"\n";
          }

          if (cmSystemTools::FileExists(header_bt.Value) &&
              firstHeaderOnDisk.empty()) {
            firstHeaderOnDisk = header_bt.Value;
          }
        }
        if (language == "CXX" && !this->GetGlobalGenerator()->IsXcode()) {
          file << "#endif // __cplusplus\n";
        }
        if (this->GetGlobalGenerator()->IsXcode()) {
          file << "#endif // CMAKE_SKIP_PRECOMPILE_HEADERS\n";
        }
        if (pchEpilogue) {
          file << *pchEpilogue << "\n";
        }
      }

      if (!firstHeaderOnDisk.empty()) {
        cmFileTimes::Copy(firstHeaderOnDisk, filename_tmp);
      }

      cmSystemTools::MoveFileIfDifferent(filename_tmp, filename);
    }
  }
  return inserted.first->second;
}